

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O1

bool __thiscall QDialogPrivate::canBeNativeDialog(QDialogPrivate *this)

{
  char cVar1;
  undefined1 uVar2;
  long lVar3;
  uint uVar4;
  
  cVar1 = QCoreApplication::testAttribute(AA_DontUseNativeDialogs);
  if (cVar1 == '\0') {
    lVar3 = QMetaObject::cast((QObject *)&QFileDialog::staticMetaObject);
    uVar4 = 0;
    if (lVar3 == 0) {
      lVar3 = QMetaObject::cast((QObject *)&QColorDialog::staticMetaObject);
      uVar4 = 1;
      if (lVar3 == 0) {
        lVar3 = QMetaObject::cast((QObject *)&QFontDialog::staticMetaObject);
        uVar4 = 2;
        if (lVar3 == 0) {
          lVar3 = QMetaObject::cast((QObject *)&QMessageBox::staticMetaObject);
          uVar4 = 3;
          if (lVar3 == 0) {
            lVar3 = QMetaObject::cast((QObject *)&QErrorMessage::staticMetaObject);
            uVar4 = -(uint)(lVar3 == 0) | 3;
          }
        }
      }
    }
    if (-1 < (int)uVar4) {
      uVar2 = (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x30))();
      return (bool)uVar2;
    }
  }
  return false;
}

Assistant:

bool QDialogPrivate::canBeNativeDialog() const
{
    if (QCoreApplication::testAttribute(Qt::AA_DontUseNativeDialogs))
        return false;

    QDialogPrivate *ncThis = const_cast<QDialogPrivate *>(this);
    QDialog *dialog = ncThis->q_func();
    const int type = themeDialogType(dialog);
    if (type >= 0)
        return QGuiApplicationPrivate::platformTheme()
                ->usePlatformNativeDialog(static_cast<QPlatformTheme::DialogType>(type));
    return false;
}